

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O3

vec3 polyscope::view::getFrontVec(void)

{
  undefined1 auVar1 [12];
  uint uVar2;
  vec3 vVar3;
  vec3 vVar4;
  
  uVar2 = 0;
  switch(frontDir) {
  case 0:
    vVar3._0_8_ = SUB648(ZEXT464(0x3f800000),0);
    vVar3.field_2.z = 0.0;
    return vVar3;
  case 1:
    return (vec3)ZEXT812(0x3f80000000000000);
  case 2:
    uVar2 = 0x3f800000;
    break;
  case 3:
    vVar4._0_8_ = SUB648(ZEXT464(0xbf800000),0);
    vVar4.field_2.z = 0.0;
    return vVar4;
  case 4:
    return (vec3)ZEXT812(0xbf80000000000000);
  case 5:
    uVar2 = 0xbf800000;
  }
  auVar1._4_8_ = 0;
  auVar1._0_4_ = uVar2;
  return (vec3)(auVar1 << 0x40);
}

Assistant:

glm::vec3 getFrontVec() {
  switch (frontDir) {
  case FrontDir::NegXFront:
    return glm::vec3{-1., 0., 0.};
  case FrontDir::XFront:
    return glm::vec3{1., 0., 0.};
  case FrontDir::NegYFront:
    return glm::vec3{0., -1., 0.};
  case FrontDir::YFront:
    return glm::vec3{0., 1., 0.};
  case FrontDir::NegZFront:
    return glm::vec3{0., 0., -1.};
  case FrontDir::ZFront:
    return glm::vec3{0., 0., 1.};
  }

  // unused fallthrough
  return glm::vec3{0., 0., 0.};
}